

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

void llb_buildsystem_command_interface_task_discovered_dependency
               (llb_task_interface_t ti,llb_build_key_t *key)

{
  TaskInterface local_40;
  string local_30 [32];
  
  local_40.ctx = ti.ctx;
  local_40.impl = ti.impl;
  std::__cxx11::string::string(local_30,(string *)(key + 0x10));
  llbuild::core::TaskInterface::discoveredDependency(&local_40,(KeyType *)local_30);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void llb_buildsystem_command_interface_task_discovered_dependency(llb_task_interface_t ti, llb_build_key_t* key) {
  auto coreti = reinterpret_cast<core::TaskInterface*>(&ti);
  coreti->discoveredDependency(((CAPIBuildKey *)key)->getInternalBuildKey().toData());
}